

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O3

int luaD_poscall(lua_State *L,StkId firstResult)

{
  int *piVar1;
  int iVar2;
  CallInfo *pCVar3;
  uint uVar4;
  StkId pTVar5;
  StkId pTVar6;
  int iVar7;
  TValue *o2;
  
  if ((L->hookmask & 2) != 0) {
    pTVar6 = L->stack;
    luaD_callhook(L,1,-1);
    if ((((L->ci->func->value).gc)->h).flags == '\0') {
      while ((L->hookmask & 2) != 0) {
        piVar1 = &L->ci->tailcalls;
        iVar2 = *piVar1;
        *piVar1 = *piVar1 + -1;
        if (iVar2 == 0) break;
        luaD_callhook(L,4,-1);
      }
    }
    firstResult = (StkId)(((long)firstResult - (long)pTVar6) + (long)L->stack);
  }
  pCVar3 = L->ci;
  L->ci = pCVar3 + -1;
  pTVar6 = pCVar3->func;
  iVar2 = pCVar3->nresults;
  L->base = pCVar3[-1].base;
  L->savedpc = pCVar3[-1].savedpc;
  if (iVar2 != 0) {
    iVar7 = 0;
    pTVar5 = pTVar6;
    do {
      if (L->top <= firstResult) {
        pTVar6 = pTVar5;
        if (0 < iVar2 - iVar7) {
          uVar4 = (iVar2 + 1) - iVar7;
          do {
            pTVar5->tt = 0;
            pTVar5 = pTVar5 + 1;
            uVar4 = uVar4 - 1;
            pTVar6 = pTVar5;
          } while (1 < uVar4);
        }
        break;
      }
      pTVar6 = pTVar5 + 1;
      pTVar5->value = firstResult->value;
      pTVar5->tt = firstResult->tt;
      iVar7 = iVar7 + 1;
      firstResult = firstResult + 1;
      pTVar5 = pTVar6;
    } while (iVar2 != iVar7);
  }
  L->top = pTVar6;
  return iVar2 + 1;
}

Assistant:

int luaD_poscall (lua_State *L, StkId firstResult) {
  StkId res;
  int wanted, i;
  CallInfo *ci;
  if (L->hookmask & LUA_MASKRET)
    firstResult = callrethooks(L, firstResult);
  ci = L->ci--;
  res = ci->func;  /* res == final position of 1st result */
  wanted = ci->nresults;
  L->base = (ci - 1)->base;  /* restore base */
  L->savedpc = (ci - 1)->savedpc;  /* restore savedpc */
  /* move results to correct place */
  for (i = wanted; i != 0 && firstResult < L->top; i--)
    setobjs2s(L, res++, firstResult++);
  while (i-- > 0)
    setnilvalue(res++);
  L->top = res;
  return (wanted - LUA_MULTRET);  /* 0 iff wanted == LUA_MULTRET */
}